

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_dpg.h
# Opt level: O0

ElemMat * __thiscall
projects::dpg::ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
::Eval(ElemMat *__return_storage_ptr__,
      ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_> *this,
      Entity *cell)

{
  double dVar1;
  long *plVar2;
  PrecomputedScalarReferenceFiniteElement<double> *pPVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  size_type sVar8;
  ostream *poVar9;
  QuadRule *pQVar10;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_01;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other_00;
  undefined4 extraout_var;
  MatrixXd *pMVar11;
  ulong uVar12;
  Index IVar13;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this_02;
  CoeffReturnType pdVar14;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar15;
  reference scalar;
  ConstColXpr local_1190;
  ConstTransposeReturnType local_1158;
  ConstColXpr local_1120;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_10e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1088;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>
  local_1000;
  double local_f40;
  double w;
  size_type k;
  undefined1 local_f29;
  undefined1 local_f28 [8];
  vector<double,_std::allocator<double>_> gammaeval;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  allocator<char> local_e49;
  string local_e48;
  stringstream local_e28 [8];
  stringstream ss_5;
  ostream local_e18 [376];
  undefined1 local_ca0 [8];
  VectorXd determinants;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  stringstream local_ba8 [8];
  stringstream ss_4;
  ostream local_b98 [383];
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  allocator<char> local_959;
  string local_958;
  stringstream local_938 [8];
  stringstream ss_3;
  ostream local_928 [376];
  long *local_7b0;
  Geometry *geo_ptr;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  stringstream local_6c0 [8];
  stringstream ss_2;
  ostream local_6b0 [383];
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  RefEl local_449;
  stringstream local_448 [8];
  stringstream ss_1;
  ostream local_438 [383];
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  RefEl local_1d5 [13];
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [383];
  RefEl local_39;
  PrecomputedScalarReferenceFiniteElement<double> *local_38;
  PrecomputedScalarReferenceFiniteElement<double> *pfe_test;
  reference local_28;
  PrecomputedScalarReferenceFiniteElement<double> *pfe_trial;
  Entity *cell_local;
  ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_> *this_local;
  elem_mat_t *mat;
  
  pfe_trial = (PrecomputedScalarReferenceFiniteElement<double> *)cell;
  cell_local = (Entity *)this;
  this_local = (ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
                *)__return_storage_ptr__;
  iVar5 = (*cell->_vptr_Entity[4])();
  pfe_test._7_1_ = (undefined1)iVar5;
  uVar6 = lf::base::RefEl::Id((RefEl *)((long)&pfe_test + 7));
  local_28 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
             operator[](&this->fe_precomp_trial_,(ulong)uVar6);
  iVar5 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
            _vptr_ScalarReferenceFiniteElement[4])();
  local_39.type_ = (RefElType)iVar5;
  uVar6 = lf::base::RefEl::Id(&local_39);
  local_38 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
             operator[](&this->fe_precomp_test_,(ulong)uVar6);
  bVar4 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::isInitialized(local_28);
  if (!bVar4) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar9 = std::operator<<(local_1b8,"No local shape function on trial space for entity type ");
    iVar5 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
              _vptr_ScalarReferenceFiniteElement[4])();
    local_1d5[0].type_ = (RefElType)iVar5;
    lf::base::operator<<(poVar9,local_1d5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"pfe_trial.isInitialized()",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_221);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1f8,&local_220,0x1ba,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"false",&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
    lf::base::AssertionFailed(&local_268,&local_290,0x1ba,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    abort();
  }
  bVar4 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::isInitialized(local_38);
  if (!bVar4) {
    std::__cxx11::stringstream::stringstream(local_448);
    poVar9 = std::operator<<(local_438,"No local shape function on test space for entity type ");
    iVar5 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
              _vptr_ScalarReferenceFiniteElement[4])();
    local_449.type_ = (RefElType)iVar5;
    lf::base::operator<<(poVar9,&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"pfe_test.isInitialized()",&local_471);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_499);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_470,&local_498,0x1bd,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator(&local_499);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"false",&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"",&local_531);
    lf::base::AssertionFailed(&local_4e0,&local_508,0x1bd,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator(&local_531);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    abort();
  }
  pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
  this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)lf::quad::QuadRule::Points(pQVar10);
  pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_38);
  other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
          lf::quad::QuadRule::Points(pQVar10);
  bVar4 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator==(this_00,other);
  if (bVar4) {
    pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
    this_01 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)lf::quad::QuadRule::Weights(pQVar10);
    pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_38);
    other_00 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               lf::quad::QuadRule::Weights(pQVar10);
    bVar4 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator==(this_01,other_00);
    if (bVar4) {
      pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
      sVar7 = lf::quad::QuadRule::NumPoints(pQVar10);
      pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_38);
      sVar8 = lf::quad::QuadRule::NumPoints(pQVar10);
      if (sVar7 == sVar8) {
        iVar5 = (*(pfe_trial->super_ScalarReferenceFiniteElement<double>).
                  _vptr_ScalarReferenceFiniteElement[3])();
        local_7b0 = (long *)CONCAT44(extraout_var,iVar5);
        if (local_7b0 == (long *)0x0) {
          std::__cxx11::stringstream::stringstream(local_938);
          std::operator<<(local_928,"Invalid geometry");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,"geo_ptr != nullptr",&local_959);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_980,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_981);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_958,&local_980,0x1c6,&local_9a8);
          std::__cxx11::string::~string((string *)&local_9a8);
          std::__cxx11::string::~string((string *)&local_980);
          std::allocator<char>::~allocator(&local_981);
          std::__cxx11::string::~string((string *)&local_958);
          std::allocator<char>::~allocator(&local_959);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9c8,"false",&local_9c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_9f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"",&local_a19);
          lf::base::AssertionFailed(&local_9c8,&local_9f0,0x1c6,&local_a18);
          std::__cxx11::string::~string((string *)&local_a18);
          std::allocator<char>::~allocator(&local_a19);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::allocator<char>::~allocator(&local_9f1);
          std::__cxx11::string::~string((string *)&local_9c8);
          std::allocator<char>::~allocator(&local_9c9);
          abort();
        }
        iVar5 = (**(code **)*local_7b0)();
        plVar2 = local_7b0;
        if (iVar5 != 2) {
          std::__cxx11::stringstream::stringstream(local_ba8);
          std::operator<<(local_b98,"Only 2D implementation available");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc8,"geo_ptr->DimLocal() == 2",&local_bc9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bf0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_bf1);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_bc8,&local_bf0,0x1c7,&local_c18);
          std::__cxx11::string::~string((string *)&local_c18);
          std::__cxx11::string::~string((string *)&local_bf0);
          std::allocator<char>::~allocator(&local_bf1);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::allocator<char>::~allocator(&local_bc9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c38,"false",&local_c39);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c60,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_c61);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c88,"",
                     (allocator<char> *)
                     ((long)&determinants.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 7));
          lf::base::AssertionFailed(&local_c38,&local_c60,0x1c7,&local_c88);
          std::__cxx11::string::~string((string *)&local_c88);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&determinants.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 7));
          std::__cxx11::string::~string((string *)&local_c60);
          std::allocator<char>::~allocator(&local_c61);
          std::__cxx11::string::~string((string *)&local_c38);
          std::allocator<char>::~allocator(&local_c39);
          abort();
        }
        pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        pMVar11 = lf::quad::QuadRule::Points(pQVar10);
        (**(code **)(*plVar2 + 0x30))
                  ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ca0,plVar2,pMVar11);
        uVar12 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                           ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ca0);
        pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        sVar7 = lf::quad::QuadRule::NumPoints(pQVar10);
        pPVar3 = pfe_trial;
        if (uVar12 != sVar7) {
          std::__cxx11::stringstream::stringstream(local_e28);
          poVar9 = std::operator<<(local_e18,"Mismatch ");
          IVar13 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                             ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ca0);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,IVar13);
          poVar9 = std::operator<<(poVar9," <-> ");
          pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
          sVar7 = lf::quad::QuadRule::NumPoints(pQVar10);
          std::ostream::operator<<(poVar9,sVar7);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e48,"determinants.size() == pfe_trial.Qr().NumPoints()",
                     &local_e49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e70,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_e71);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_e48,&local_e70,0x1d0,&local_e98);
          std::__cxx11::string::~string((string *)&local_e98);
          std::__cxx11::string::~string((string *)&local_e70);
          std::allocator<char>::~allocator(&local_e71);
          std::__cxx11::string::~string((string *)&local_e48);
          std::allocator<char>::~allocator(&local_e49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_eb8,"false",&local_eb9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ee0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,&local_ee1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f08,"",
                     (allocator<char> *)
                     ((long)&gammaeval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          lf::base::AssertionFailed(&local_eb8,&local_ee0,0x1d0,&local_f08);
          std::__cxx11::string::~string((string *)&local_f08);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&gammaeval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          std::__cxx11::string::~string((string *)&local_ee0);
          std::allocator<char>::~allocator(&local_ee1);
          std::__cxx11::string::~string((string *)&local_eb8);
          std::allocator<char>::~allocator(&local_eb9);
          abort();
        }
        pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
        pMVar11 = lf::quad::QuadRule::Points(pQVar10);
        lf::mesh::utils::MeshFunctionConstant<double>::operator()
                  ((vector<double,_std::allocator<double>_> *)local_f28,&this->gamma_,
                   (Entity *)pPVar3,pMVar11);
        local_f29 = 0;
        k = (*(local_38->super_ScalarReferenceFiniteElement<double>).
              _vptr_ScalarReferenceFiniteElement[4])();
        w._4_4_ = (*(local_28->super_ScalarReferenceFiniteElement<double>).
                    _vptr_ScalarReferenceFiniteElement[4])();
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&k,(uint *)((long)&w + 4))
        ;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__);
        w._0_4_ = 0;
        while( true ) {
          uVar6 = w._0_4_;
          pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
          sVar7 = lf::quad::QuadRule::NumPoints(pQVar10);
          if (sVar7 <= uVar6) break;
          pQVar10 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_28);
          this_02 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                    lf::quad::QuadRule::Weights(pQVar10);
          pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                              (this_02,(ulong)w._0_4_);
          dVar1 = *pdVar14;
          pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                               local_ca0,(ulong)w._0_4_);
          local_f40 = dVar1 * *pdVar14;
          pDVar15 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                    lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
                    PrecompReferenceShapeFunctions(local_38);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_1120,pDVar15,(ulong)w._0_4_);
          Eigen::operator*(&local_10e8,&local_f40,(StorageBaseType *)&local_1120);
          scalar = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_f28,(ulong)w._0_4_);
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator*(&local_1088,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_10e8,scalar);
          pDVar15 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                    lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
                    PrecompReferenceShapeFunctions(local_28);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_1190,pDVar15,(ulong)w._0_4_);
          Eigen::
          DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
          transpose(&local_1158,
                    (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_1190);
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
          ::operator*(&local_1000,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                       *)&local_1088,
                      (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                       *)&local_1158);
          Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                    ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
                     (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                      *)&local_1000);
          w._0_4_ = w._0_4_ + 1;
        }
        local_f29 = 1;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_f28);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_ca0);
        return __return_storage_ptr__;
      }
    }
  }
  std::__cxx11::stringstream::stringstream(local_6c0);
  std::operator<<(local_6b0,"Qr missmatch");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,
             "pfe_trial.Qr().Points() == pfe_test.Qr().Points() && pfe_trial.Qr().Weights() == pfe_test.Qr().Weights() && pfe_trial.Qr().NumPoints() == pfe_test.Qr().NumPoints()"
             ,&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
             ,&local_709);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_6e0,&local_708,0x1c2,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"false",&local_751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
             ,&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"",(allocator<char> *)((long)&geo_ptr + 7));
  lf::base::AssertionFailed(&local_750,&local_778,0x1c2,&local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&geo_ptr + 7));
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  abort();
}

Assistant:

typename ReactionElementMatrixProvider<SCALAR, REACTION_COEFF>::ElemMat
ReactionElementMatrixProvider<SCALAR, REACTION_COEFF>::Eval(
    const lf::mesh::Entity& cell) {
  // Obtain precomputed information about values of local shape functions
  // and their gradients at quadrature points.
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<SCALAR>& pfe_trial =
      fe_precomp_trial_[cell.RefEl().Id()];
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<SCALAR>& pfe_test =
      fe_precomp_test_[cell.RefEl().Id()];

  // check initialization:
  LF_ASSERT_MSG(pfe_trial.isInitialized(),
                "No local shape function on trial space for entity type "
                    << cell.RefEl());
  LF_ASSERT_MSG(
      pfe_test.isInitialized(),
      "No local shape function on test space for entity type " << cell.RefEl());
  // check the consistency of the quadratrue rules used.
  LF_ASSERT_MSG(pfe_trial.Qr().Points() == pfe_test.Qr().Points() &&
                    pfe_trial.Qr().Weights() == pfe_test.Qr().Weights() &&
                    pfe_trial.Qr().NumPoints() == pfe_test.Qr().NumPoints(),
                "Qr missmatch");

  // query the geometry of the cell.
  const lf::geometry::Geometry* geo_ptr = cell.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry");
  LF_ASSERT_MSG(geo_ptr->DimLocal() == 2, "Only 2D implementation available");

  // const lf::uscalfe::dim_t world_dim = geo_ptr->DimGlobal();

  // retrive information for parametric fem computation:
  const Eigen::VectorXd determinants(
      geo_ptr->IntegrationElement(pfe_trial.Qr().Points()));
  LF_ASSERT_MSG(determinants.size() == pfe_trial.Qr().NumPoints(),
                "Mismatch " << determinants.size() << " <-> "
                            << pfe_trial.Qr().NumPoints());

  // evaluate gamm in the quadrature points.
  auto gammaeval = gamma_(cell, pfe_trial.Qr().Points());

  // initialize element matrix.
  elem_mat_t mat(pfe_test.NumRefShapeFunctions(),
                 pfe_trial.NumRefShapeFunctions());
  mat.setZero();

  for (size_type k = 0; k < pfe_trial.Qr().NumPoints(); ++k) {
    // transformed quadratrue weight.
    const double w = pfe_trial.Qr().Weights()[k] * determinants[k];
    // update element matrix.
    mat += w * pfe_test.PrecompReferenceShapeFunctions().col(k) * gammaeval[k] *
           pfe_trial.PrecompReferenceShapeFunctions().col(k).transpose();
  }

  return mat;
}